

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GetVectorLen
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  bool bVar1;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  local_30 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)field;
  field_local = (FieldDef *)struct_def;
  struct_def_local = (StructDef *)this;
  GenReceiver(this,struct_def,code_ptr);
  Namer::Method<flatbuffers::FieldDef>
            (&local_70,&(this->namer_).super_Namer,(FieldDef *)code_ptr_local);
  std::operator+(&local_50,&local_70,"Length(self)");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  if (((((this->super_BaseGenerator).parser_)->opts).python_typing & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)local_30," -> int");
  }
  std::__cxx11::string::operator+=((string *)local_30,":");
  bVar1 = IsArray((Type *)&code_ptr_local[6]._M_string_length);
  if (bVar1) {
    GenIndents_abi_cxx11_(&local_1a0,this,2);
    std::operator+(&local_180,&local_1a0,"return ");
    NumToString<unsigned_short>(&local_1c0,*(unsigned_short *)(code_ptr_local + 7));
    std::operator+(&local_160,&local_180,&local_1c0);
    std::operator+(&local_140,&local_160,"\n\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  else {
    OffsetPrefix_abi_cxx11_(&local_a0,this,(FieldDef *)code_ptr_local,false);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    GenIndents_abi_cxx11_(&local_e0,this,3);
    std::operator+(&local_c0,&local_e0,"return self._tab.VectorLen(o)");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    GenIndents_abi_cxx11_(&local_120,this,2);
    std::operator+(&local_100,&local_120,"return 0\n\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  return;
}

Assistant:

void GetVectorLen(const StructDef &struct_def, const FieldDef &field,
                    std::string *code_ptr) const {
    auto &code = *code_ptr;

    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field) + "Length(self)";
    if (parser_.opts.python_typing) { code += " -> int"; }
    code += ":";
    if (!IsArray(field.value.type)) {
      code += OffsetPrefix(field, false);
      code += GenIndents(3) + "return self._tab.VectorLen(o)";
      code += GenIndents(2) + "return 0\n\n";
    } else {
      code += GenIndents(2) + "return " +
              NumToString(field.value.type.fixed_length) + "\n\n";
    }
  }